

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  int *piVar1;
  _func_int **pp_Var2;
  Layer *pLVar3;
  void **ppvVar4;
  ParamDictPrivate **ppPVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Option opt;
  int q_2;
  Mat weights_2 [2];
  ParamDict pd_2;
  int q_1;
  Mat weights_1 [1];
  ParamDict pd_1;
  int q;
  Mat weights [1];
  ParamDict pd;
  Layer *op;
  Option *in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  size_t in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff6cc;
  Mat *in_stack_fffffffffffff6d0;
  ParamDict *local_910;
  ParamDict *local_878;
  void **local_830;
  void **local_7d0;
  void **local_788;
  void **local_728;
  undefined1 local_710 [4];
  undefined4 local_70c;
  undefined1 local_6d0 [20];
  int local_6bc;
  void *local_6b8;
  int *local_6b0;
  undefined8 local_6a8;
  undefined4 local_6a0;
  long *local_698;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  undefined8 local_678;
  ParamDict local_670;
  undefined8 local_660;
  undefined4 local_658;
  long *local_650;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  undefined8 local_630;
  ParamDict local_628;
  _func_int **local_618;
  undefined4 local_610;
  _func_int **local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  _func_int **local_5e8;
  void *local_5e0;
  int *local_5d8;
  void *local_5d0;
  undefined4 local_5c8;
  long *local_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  void *local_5a0;
  ParamDict local_598;
  undefined1 local_588 [20];
  int local_574;
  void *local_570;
  int *local_568;
  undefined8 local_560;
  undefined4 local_558;
  long *local_550;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined8 local_530;
  void *local_528;
  int *local_520;
  void *local_518;
  undefined4 local_510;
  long *local_508;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  void *local_4e8;
  void *pvStack_4e0;
  ParamDict local_4d8;
  undefined1 local_4c8 [20];
  int local_4b4;
  void *local_4b0;
  int *local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  long *local_490;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined8 local_470;
  void *local_468;
  int *local_460;
  void *local_458;
  undefined4 local_450;
  long *local_448;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  void *local_428;
  void *apvStack_420 [3];
  ParamDict local_408;
  Layer *local_3f8;
  long local_3f0;
  long local_3e8;
  void **local_3d8;
  void **local_3d0;
  ParamDict *local_3c8;
  void **local_3b8;
  void **local_3a8;
  void **local_390;
  void **local_380;
  ParamDict *local_368;
  void **local_358;
  ParamDictPrivate **local_348;
  int local_338;
  undefined4 local_334;
  void **local_330;
  void **local_328;
  void **local_320;
  int local_318;
  undefined4 local_314;
  ParamDict *local_310;
  ParamDict *local_308;
  ParamDict *local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  void **local_2e8;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  void **local_2c8;
  void **local_2c0;
  int local_2b8;
  undefined4 local_2b4;
  void **local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_298;
  undefined4 local_294;
  ParamDict *local_290;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  ParamDictPrivate **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  ParamDict *local_220;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  int local_1d8;
  undefined4 local_1d4;
  void **local_1d0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_154;
  void **local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_134;
  void **local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_114;
  ParamDict *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f4;
  void **local_f0;
  long local_e8;
  void **local_e0;
  long local_d8;
  ParamDict *local_d0;
  long local_c8;
  void **local_c0;
  long local_b8;
  void **local_b0;
  void *local_a0;
  void *local_90;
  void *local_78;
  void *local_68;
  _func_int **local_50;
  void *local_40;
  ParamDictPrivate *local_30;
  
  local_3e8 = in_RSI;
  if ((in_RSI == 0) || (in_RDX != 0)) {
    local_3f0 = in_RDX;
    if ((in_RSI == 0) && (in_RDX != 0)) {
      local_3f8 = create_layer(in_stack_fffffffffffff6bc);
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff6d0);
      ParamDict::set(&local_4d8,0,*(int *)(in_RDI + 0x38));
      (*local_3f8->_vptr_Layer[2])(local_3f8,&local_4d8);
      local_7d0 = &local_528;
      do {
        local_3d0 = local_7d0;
        *local_7d0 = (void *)0x0;
        local_7d0[1] = (void *)0x0;
        local_7d0[2] = (void *)0x0;
        *(undefined4 *)(local_7d0 + 3) = 0;
        local_7d0[4] = (void *)0x0;
        *(undefined4 *)(local_7d0 + 5) = 0;
        *(undefined4 *)((long)local_7d0 + 0x2c) = 0;
        *(undefined4 *)(local_7d0 + 6) = 0;
        *(undefined4 *)((long)local_7d0 + 0x34) = 0;
        *(undefined4 *)(local_7d0 + 7) = 0;
        local_7d0[8] = (void *)0x0;
        local_7d0 = local_7d0 + 9;
      } while (local_7d0 != &pvStack_4e0);
      local_134 = *(undefined4 *)(in_RDI + 0x38);
      local_130 = &local_570;
      local_140 = 4;
      local_148 = 0;
      local_570 = (void *)0x0;
      local_568 = (int *)0x0;
      local_560 = 0;
      local_558 = 0;
      local_550 = (long *)0x0;
      local_548 = 0;
      local_544 = 0;
      local_540 = 0;
      local_53c = 0;
      local_538 = 0;
      local_530 = 0;
      create(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c0,
             (Allocator *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      local_2f0 = &local_570;
      local_2e8 = &local_528;
      if (&local_528 != local_2f0) {
        if (local_568 != (int *)0x0) {
          local_2f4 = 1;
          LOCK();
          local_2f8 = *local_568;
          *local_568 = *local_568 + 1;
          UNLOCK();
        }
        local_2a0 = &local_528;
        if (local_520 != (int *)0x0) {
          local_2a4 = 0xffffffff;
          LOCK();
          local_2a8 = *local_520;
          *local_520 = *local_520 + -1;
          UNLOCK();
          if (local_2a8 == 1) {
            if (local_508 == (long *)0x0) {
              if (local_528 != (void *)0x0) {
                free(local_528);
              }
            }
            else {
              (**(code **)(*local_508 + 0x18))(local_508,local_528);
            }
          }
        }
        local_528 = (void *)0x0;
        local_518 = (void *)0x0;
        local_510 = 0;
        local_500 = 0;
        local_4fc = 0;
        local_4f8 = 0;
        local_4f4 = 0;
        local_4f0 = 0;
        local_4e8 = (void *)0x0;
        local_520 = (int *)0x0;
        local_528 = *local_2f0;
        local_520 = (int *)local_2f0[1];
        local_518 = local_2f0[2];
        local_510 = *(undefined4 *)(local_2f0 + 3);
        local_508 = (long *)local_2f0[4];
        local_500 = *(undefined4 *)(local_2f0 + 5);
        local_4fc = *(undefined4 *)((long)local_2f0 + 0x2c);
        local_4f8 = *(undefined4 *)(local_2f0 + 6);
        local_4f4 = *(undefined4 *)((long)local_2f0 + 0x34);
        local_4f0 = *(undefined4 *)(local_2f0 + 7);
        local_4e8 = local_2f0[8];
      }
      local_390 = &local_570;
      local_2e0 = &local_528;
      local_1d0 = local_390;
      if (local_568 != (int *)0x0) {
        local_1d4 = 0xffffffff;
        LOCK();
        local_1d8 = *local_568;
        *local_568 = *local_568 + -1;
        UNLOCK();
        if (local_1d8 == 1) {
          if (local_550 == (long *)0x0) {
            local_78 = local_570;
            if (local_570 != (void *)0x0) {
              free(local_570);
            }
          }
          else {
            (**(code **)(*local_550 + 0x18))(local_550,local_570);
          }
        }
      }
      pLVar3 = local_3f8;
      local_570 = (void *)0x0;
      local_560 = 0;
      local_558 = 0;
      local_548 = 0;
      local_544 = 0;
      local_540 = 0;
      local_53c = 0;
      local_538 = 0;
      local_530 = 0;
      local_568 = (int *)0x0;
      for (local_574 = 0; local_574 < *(int *)(in_RDI + 0x38); local_574 = local_574 + 1) {
        local_c0 = &local_528;
        local_c8 = (long)local_574;
        *(undefined4 *)((long)local_528 + local_c8 * 4) =
             *(undefined4 *)(local_3f0 + (long)local_574 * 4);
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff6d0,
                 (Mat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      (*pLVar3->_vptr_Layer[3])(pLVar3,local_588);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff6b0)
      ;
      local_830 = &pvStack_4e0;
      do {
        ppvVar4 = local_830 + -9;
        local_380 = ppvVar4;
        local_1f0 = ppvVar4;
        if (local_830[-8] != (void *)0x0) {
          piVar1 = (int *)local_830[-8];
          local_1f4 = 0xffffffff;
          LOCK();
          local_1f8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1f8 == 1) {
            if (local_830[-5] == (void *)0x0) {
              local_68 = *ppvVar4;
              if (local_68 != (void *)0x0) {
                free(local_68);
              }
            }
            else {
              (**(code **)(*local_830[-5] + 0x18))(local_830[-5],*ppvVar4);
            }
          }
        }
        *ppvVar4 = (void *)0x0;
        local_830[-7] = (void *)0x0;
        *(undefined4 *)(local_830 + -6) = 0;
        *(undefined4 *)(local_830 + -4) = 0;
        *(undefined4 *)((long)local_830 + -0x1c) = 0;
        *(undefined4 *)(local_830 + -3) = 0;
        *(undefined4 *)((long)local_830 + -0x14) = 0;
        *(undefined4 *)(local_830 + -2) = 0;
        local_830[-1] = (void *)0x0;
        local_830[-8] = (void *)0x0;
        local_830 = ppvVar4;
      } while (ppvVar4 != &local_528);
      ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff6b0);
    }
    else {
      if (in_RSI == 0) {
        return;
      }
      if (in_RDX == 0) {
        return;
      }
      local_3f8 = create_layer(in_stack_fffffffffffff6bc);
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff6d0);
      ParamDict::set(&local_598,0,*(int *)(in_RDI + 0x38));
      ParamDict::set(&local_598,1,1);
      (*local_3f8->_vptr_Layer[2])(local_3f8,&local_598);
      local_878 = &local_628;
      do {
        local_3c8 = local_878;
        local_878->_vptr_ParamDict = (_func_int **)0x0;
        local_878->d = (ParamDictPrivate *)0x0;
        local_878[1]._vptr_ParamDict = (_func_int **)0x0;
        *(undefined4 *)&local_878[1].d = 0;
        local_878[2]._vptr_ParamDict = (_func_int **)0x0;
        *(undefined4 *)&local_878[2].d = 0;
        *(undefined4 *)((long)&local_878[2].d + 4) = 0;
        *(undefined4 *)&local_878[3]._vptr_ParamDict = 0;
        *(undefined4 *)((long)&local_878[3]._vptr_ParamDict + 4) = 0;
        *(undefined4 *)&local_878[3].d = 0;
        local_878[4]._vptr_ParamDict = (_func_int **)0x0;
        local_878 = (ParamDict *)&local_878[4].d;
      } while (local_878 != &local_598);
      local_114 = *(undefined4 *)(in_RDI + 0x38);
      local_110 = &local_670;
      local_120 = 4;
      local_128 = 0;
      local_670._vptr_ParamDict = (_func_int **)0x0;
      local_670.d = (ParamDictPrivate *)0x0;
      local_660 = 0;
      local_658 = 0;
      local_650 = (long *)0x0;
      local_648 = 0;
      local_644 = 0;
      local_640 = 0;
      local_63c = 0;
      local_638 = 0;
      local_630 = 0;
      create(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c0,
             (Allocator *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      local_310 = &local_670;
      local_308 = &local_628;
      if (&local_628 != local_310) {
        if (local_670.d != (ParamDictPrivate *)0x0) {
          local_314 = 1;
          LOCK();
          local_318 = (local_670.d)->params[0].type;
          (local_670.d)->params[0].type = (local_670.d)->params[0].type + 1;
          UNLOCK();
        }
        local_290 = &local_628;
        if (local_628.d != (ParamDictPrivate *)0x0) {
          local_294 = 0xffffffff;
          LOCK();
          local_298 = (local_628.d)->params[0].type;
          (local_628.d)->params[0].type = (local_628.d)->params[0].type + -1;
          UNLOCK();
          if (local_298 == 1) {
            if (local_608 == (_func_int **)0x0) {
              if (local_628._vptr_ParamDict != (_func_int **)0x0) {
                free(local_628._vptr_ParamDict);
              }
            }
            else {
              (**(code **)(*local_608 + 0x18))(local_608,local_628._vptr_ParamDict);
            }
          }
        }
        local_628._vptr_ParamDict = (_func_int **)0x0;
        local_618 = (_func_int **)0x0;
        local_610 = 0;
        local_600 = 0;
        local_5fc = 0;
        local_5f8 = 0;
        local_5f4 = 0;
        local_5f0 = 0;
        local_5e8 = (_func_int **)0x0;
        local_628.d = (ParamDictPrivate *)0x0;
        local_628._vptr_ParamDict = local_310->_vptr_ParamDict;
        local_628.d = local_310->d;
        local_618 = local_310[1]._vptr_ParamDict;
        local_610 = *(undefined4 *)&local_310[1].d;
        local_608 = local_310[2]._vptr_ParamDict;
        local_600 = *(undefined4 *)&local_310[2].d;
        local_5fc = *(undefined4 *)((long)&local_310[2].d + 4);
        local_5f8 = *(undefined4 *)&local_310[3]._vptr_ParamDict;
        local_5f4 = *(undefined4 *)((long)&local_310[3]._vptr_ParamDict + 4);
        local_5f0 = *(undefined4 *)&local_310[3].d;
        local_5e8 = local_310[4]._vptr_ParamDict;
      }
      local_368 = &local_670;
      local_300 = &local_628;
      local_220 = local_368;
      if (local_670.d != (ParamDictPrivate *)0x0) {
        local_224 = 0xffffffff;
        LOCK();
        local_228 = (local_670.d)->params[0].type;
        (local_670.d)->params[0].type = (local_670.d)->params[0].type + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (local_650 == (long *)0x0) {
            local_50 = local_670._vptr_ParamDict;
            if (local_670._vptr_ParamDict != (_func_int **)0x0) {
              free(local_670._vptr_ParamDict);
            }
          }
          else {
            (**(code **)(*local_650 + 0x18))(local_650,local_670._vptr_ParamDict);
          }
        }
      }
      local_670._vptr_ParamDict = (_func_int **)0x0;
      local_660 = 0;
      local_658 = 0;
      local_648 = 0;
      local_644 = 0;
      local_640 = 0;
      local_63c = 0;
      local_638 = 0;
      local_630 = 0;
      local_670.d = (ParamDictPrivate *)0x0;
      local_f4 = *(undefined4 *)(in_RDI + 0x38);
      local_f0 = &local_6b8;
      local_100 = 4;
      local_108 = 0;
      local_6b8 = (void *)0x0;
      local_6b0 = (int *)0x0;
      local_6a8 = 0;
      local_6a0 = 0;
      local_698 = (long *)0x0;
      local_690 = 0;
      local_68c = 0;
      local_688 = 0;
      local_684 = 0;
      local_680 = 0;
      local_678 = 0;
      create(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c0,
             (Allocator *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      local_330 = &local_6b8;
      local_328 = &local_5e0;
      if (&local_5e0 != local_330) {
        if (local_6b0 != (int *)0x0) {
          local_334 = 1;
          LOCK();
          local_338 = *local_6b0;
          *local_6b0 = *local_6b0 + 1;
          UNLOCK();
        }
        local_280 = &local_5e0;
        if (local_5d8 != (int *)0x0) {
          local_284 = 0xffffffff;
          LOCK();
          local_288 = *local_5d8;
          *local_5d8 = *local_5d8 + -1;
          UNLOCK();
          if (local_288 == 1) {
            if (local_5c0 == (long *)0x0) {
              if (local_5e0 != (void *)0x0) {
                free(local_5e0);
              }
            }
            else {
              (**(code **)(*local_5c0 + 0x18))(local_5c0,local_5e0);
            }
          }
        }
        local_5e0 = (void *)0x0;
        local_5d0 = (void *)0x0;
        local_5c8 = 0;
        local_5b8 = 0;
        local_5b4 = 0;
        local_5b0 = 0;
        local_5ac = 0;
        local_5a8 = 0;
        local_5a0 = (void *)0x0;
        local_5d8 = (int *)0x0;
        local_5e0 = *local_330;
        local_5d8 = (int *)local_330[1];
        local_5d0 = local_330[2];
        local_5c8 = *(undefined4 *)(local_330 + 3);
        local_5c0 = (long *)local_330[4];
        local_5b8 = *(undefined4 *)(local_330 + 5);
        local_5b4 = *(undefined4 *)((long)local_330 + 0x2c);
        local_5b0 = *(undefined4 *)(local_330 + 6);
        local_5ac = *(undefined4 *)((long)local_330 + 0x34);
        local_5a8 = *(undefined4 *)(local_330 + 7);
        local_5a0 = local_330[8];
      }
      local_358 = &local_6b8;
      local_320 = &local_5e0;
      local_240 = local_358;
      if (local_6b0 != (int *)0x0) {
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *local_6b0;
        *local_6b0 = *local_6b0 + -1;
        UNLOCK();
        if (local_248 == 1) {
          if (local_698 == (long *)0x0) {
            local_40 = local_6b8;
            if (local_6b8 != (void *)0x0) {
              free(local_6b8);
            }
          }
          else {
            (**(code **)(*local_698 + 0x18))(local_698,local_6b8);
          }
        }
      }
      pLVar3 = local_3f8;
      local_6b8 = (void *)0x0;
      local_6a8 = 0;
      local_6a0 = 0;
      local_690 = 0;
      local_68c = 0;
      local_688 = 0;
      local_684 = 0;
      local_680 = 0;
      local_678 = 0;
      local_6b0 = (int *)0x0;
      for (local_6bc = 0; local_6bc < *(int *)(in_RDI + 0x38); local_6bc = local_6bc + 1) {
        local_d0 = &local_628;
        local_d8 = (long)local_6bc;
        *(undefined4 *)((long)local_628._vptr_ParamDict + local_d8 * 4) =
             *(undefined4 *)(local_3f0 + (long)local_6bc * 4);
        local_e0 = &local_5e0;
        local_e8 = (long)local_6bc;
        *(float *)((long)local_5e0 + local_e8 * 4) =
             -*(float *)(local_3e8 + (long)local_6bc * 4) *
             *(float *)(local_3f0 + (long)local_6bc * 4);
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff6d0,
                 (Mat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      (*pLVar3->_vptr_Layer[3])(pLVar3,local_6d0);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff6b0)
      ;
      local_910 = &local_598;
      do {
        ppPVar5 = &local_910[-5].d;
        local_348 = ppPVar5;
        local_260 = ppPVar5;
        if (local_910[-4]._vptr_ParamDict != (_func_int **)0x0) {
          pp_Var2 = local_910[-4]._vptr_ParamDict;
          local_264 = 0xffffffff;
          LOCK();
          local_268 = *(int *)pp_Var2;
          *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
          UNLOCK();
          if (local_268 == 1) {
            if (local_910[-3].d == (ParamDictPrivate *)0x0) {
              local_30 = *ppPVar5;
              if (local_30 != (ParamDictPrivate *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(*(long *)(local_910[-3].d)->params + 0x18))(local_910[-3].d,*ppPVar5);
            }
          }
        }
        *ppPVar5 = (ParamDictPrivate *)0x0;
        local_910[-4].d = (ParamDictPrivate *)0x0;
        *(undefined4 *)&local_910[-3]._vptr_ParamDict = 0;
        *(undefined4 *)&local_910[-2]._vptr_ParamDict = 0;
        *(undefined4 *)((long)&local_910[-2]._vptr_ParamDict + 4) = 0;
        *(undefined4 *)&local_910[-2].d = 0;
        *(undefined4 *)((long)&local_910[-2].d + 4) = 0;
        *(undefined4 *)&local_910[-1]._vptr_ParamDict = 0;
        local_910[-1].d = (ParamDictPrivate *)0x0;
        local_910[-4]._vptr_ParamDict = (_func_int **)0x0;
        local_910 = (ParamDict *)ppPVar5;
      } while ((ParamDict *)ppPVar5 != &local_628);
      ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff6b0);
    }
  }
  else {
    local_3f8 = create_layer(in_stack_fffffffffffff6bc);
    ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff6d0);
    ParamDict::set(&local_408,0,*(int *)(in_RDI + 0x38));
    (*local_3f8->_vptr_Layer[2])(local_3f8,&local_408);
    local_728 = &local_468;
    do {
      local_3d8 = local_728;
      *local_728 = (void *)0x0;
      local_728[1] = (void *)0x0;
      local_728[2] = (void *)0x0;
      *(undefined4 *)(local_728 + 3) = 0;
      local_728[4] = (void *)0x0;
      *(undefined4 *)(local_728 + 5) = 0;
      *(undefined4 *)((long)local_728 + 0x2c) = 0;
      *(undefined4 *)(local_728 + 6) = 0;
      *(undefined4 *)((long)local_728 + 0x34) = 0;
      *(undefined4 *)(local_728 + 7) = 0;
      local_728[8] = (void *)0x0;
      local_728 = local_728 + 9;
    } while (local_728 != apvStack_420);
    local_154 = *(undefined4 *)(in_RDI + 0x38);
    local_150 = &local_4b0;
    local_160 = 4;
    local_168 = 0;
    local_4b0 = (void *)0x0;
    local_4a8 = (int *)0x0;
    local_4a0 = 0;
    local_498 = 0;
    local_490 = (long *)0x0;
    local_488 = 0;
    local_484 = 0;
    local_480 = 0;
    local_47c = 0;
    local_478 = 0;
    local_470 = 0;
    create(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c0,
           (Allocator *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
    local_2d0 = &local_4b0;
    local_2c8 = &local_468;
    if (&local_468 != local_2d0) {
      if (local_4a8 != (int *)0x0) {
        local_2d4 = 1;
        LOCK();
        local_2d8 = *local_4a8;
        *local_4a8 = *local_4a8 + 1;
        UNLOCK();
      }
      local_2b0 = &local_468;
      if (local_460 != (int *)0x0) {
        local_2b4 = 0xffffffff;
        LOCK();
        local_2b8 = *local_460;
        *local_460 = *local_460 + -1;
        UNLOCK();
        if (local_2b8 == 1) {
          if (local_448 == (long *)0x0) {
            if (local_468 != (void *)0x0) {
              free(local_468);
            }
          }
          else {
            (**(code **)(*local_448 + 0x18))(local_448,local_468);
          }
        }
      }
      local_468 = (void *)0x0;
      local_458 = (void *)0x0;
      local_450 = 0;
      local_440 = 0;
      local_43c = 0;
      local_438 = 0;
      local_434 = 0;
      local_430 = 0;
      local_428 = (void *)0x0;
      local_460 = (int *)0x0;
      local_468 = *local_2d0;
      local_460 = (int *)local_2d0[1];
      local_458 = local_2d0[2];
      local_450 = *(undefined4 *)(local_2d0 + 3);
      local_448 = (long *)local_2d0[4];
      local_440 = *(undefined4 *)(local_2d0 + 5);
      local_43c = *(undefined4 *)((long)local_2d0 + 0x2c);
      local_438 = *(undefined4 *)(local_2d0 + 6);
      local_434 = *(undefined4 *)((long)local_2d0 + 0x34);
      local_430 = *(undefined4 *)(local_2d0 + 7);
      local_428 = local_2d0[8];
    }
    local_3b8 = &local_4b0;
    local_2c0 = &local_468;
    local_180 = local_3b8;
    if (local_4a8 != (int *)0x0) {
      local_184 = 0xffffffff;
      LOCK();
      local_188 = *local_4a8;
      *local_4a8 = *local_4a8 + -1;
      UNLOCK();
      if (local_188 == 1) {
        if (local_490 == (long *)0x0) {
          local_a0 = local_4b0;
          if (local_4b0 != (void *)0x0) {
            free(local_4b0);
          }
        }
        else {
          (**(code **)(*local_490 + 0x18))(local_490,local_4b0);
        }
      }
    }
    pLVar3 = local_3f8;
    local_4b0 = (void *)0x0;
    local_4a0 = 0;
    local_498 = 0;
    local_488 = 0;
    local_484 = 0;
    local_480 = 0;
    local_47c = 0;
    local_478 = 0;
    local_470 = 0;
    local_4a8 = (int *)0x0;
    for (local_4b4 = 0; local_4b4 < *(int *)(in_RDI + 0x38); local_4b4 = local_4b4 + 1) {
      local_b0 = &local_468;
      local_b8 = (long)local_4b4;
      *(uint *)((long)local_468 + local_b8 * 4) =
           *(uint *)(local_3e8 + (long)local_4b4 * 4) ^ 0x80000000;
    }
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffff6d0,
               (Mat *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
    (*pLVar3->_vptr_Layer[3])(pLVar3,local_4c8);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff6b0);
    local_788 = apvStack_420;
    do {
      ppvVar4 = local_788 + -9;
      local_3a8 = ppvVar4;
      local_1a0 = ppvVar4;
      if (local_788[-8] != (void *)0x0) {
        piVar1 = (int *)local_788[-8];
        local_1a4 = 0xffffffff;
        LOCK();
        local_1a8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_1a8 == 1) {
          if (local_788[-5] == (void *)0x0) {
            local_90 = *ppvVar4;
            if (local_90 != (void *)0x0) {
              free(local_90);
            }
          }
          else {
            (**(code **)(*local_788[-5] + 0x18))(local_788[-5],*ppvVar4);
          }
        }
      }
      *ppvVar4 = (void *)0x0;
      local_788[-7] = (void *)0x0;
      *(undefined4 *)(local_788 + -6) = 0;
      *(undefined4 *)(local_788 + -4) = 0;
      *(undefined4 *)((long)local_788 + -0x1c) = 0;
      *(undefined4 *)(local_788 + -3) = 0;
      *(undefined4 *)((long)local_788 + -0x14) = 0;
      *(undefined4 *)(local_788 + -2) = 0;
      local_788[-1] = (void *)0x0;
      local_788[-8] = (void *)0x0;
      local_788 = ppvVar4;
    } while (ppvVar4 != &local_468);
    ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff6b0);
  }
  Option::Option(in_stack_fffffffffffff6b0);
  local_70c = 1;
  (*local_3f8->_vptr_Layer[4])(local_3f8,local_710);
  (*local_3f8->_vptr_Layer[9])(local_3f8,in_RDI,local_710);
  (*local_3f8->_vptr_Layer[5])(local_3f8,local_710);
  if (local_3f8 != (Layer *)0x0) {
    (*local_3f8->_vptr_Layer[1])();
  }
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = -mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1; // TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}